

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O0

void __thiscall
spdlog::details::c_formatter::format
          (c_formatter *this,log_msg *param_1,tm *tm_time,memory_buffer *dest)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *pbVar1;
  string_view_t view;
  string_view_t view_00;
  char local_8d [5];
  basic_string_view<char,_std::char_traits<char>_> local_88;
  char local_75 [13];
  basic_string_view<char,_std::char_traits<char>_> local_68;
  undefined1 local_58 [8];
  scoped_pad p;
  size_t field_size;
  memory_buffer *dest_local;
  tm *tm_time_local;
  log_msg *param_1_local;
  c_formatter *this_local;
  
  p.spaces_._M_str = (char *)0x18;
  scoped_pad::scoped_pad((scoped_pad *)local_58,0x18,&(this->super_flag_formatter).padinfo_,dest);
  pbVar1 = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)(long)tm_time->tm_wday;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_68,*(char **)(days + (long)pbVar1 * 8));
  view._M_str = (char *)dest;
  view._M_len = (size_t)local_68._M_str;
  fmt_helper::append_string_view<500ul>((fmt_helper *)local_68._M_len,view,pbVar1);
  local_75[0] = ' ';
  ::fmt::v5::internal::basic_buffer<char>::push_back((basic_buffer<char> *)dest,local_75);
  pbVar1 = (basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)(long)tm_time->tm_mon;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_88,*(char **)(months + (long)pbVar1 * 8));
  view_00._M_str = (char *)dest;
  view_00._M_len = (size_t)local_88._M_str;
  fmt_helper::append_string_view<500ul>((fmt_helper *)local_88._M_len,view_00,pbVar1);
  local_8d[4] = 0x20;
  ::fmt::v5::internal::basic_buffer<char>::push_back((basic_buffer<char> *)dest,local_8d + 4);
  fmt_helper::append_int<int,500ul>(tm_time->tm_mday,dest);
  local_8d[3] = 0x20;
  ::fmt::v5::internal::basic_buffer<char>::push_back((basic_buffer<char> *)dest,local_8d + 3);
  fmt_helper::pad2<500ul>(tm_time->tm_hour,dest);
  local_8d[2] = 0x3a;
  ::fmt::v5::internal::basic_buffer<char>::push_back((basic_buffer<char> *)dest,local_8d + 2);
  fmt_helper::pad2<500ul>(tm_time->tm_min,dest);
  local_8d[1] = 0x3a;
  ::fmt::v5::internal::basic_buffer<char>::push_back((basic_buffer<char> *)dest,local_8d + 1);
  fmt_helper::pad2<500ul>(tm_time->tm_sec,dest);
  local_8d[0] = ' ';
  ::fmt::v5::internal::basic_buffer<char>::push_back((basic_buffer<char> *)dest,local_8d);
  fmt_helper::append_int<int,500ul>(tm_time->tm_year + 0x76c,dest);
  scoped_pad::~scoped_pad((scoped_pad *)local_58);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, fmt::memory_buffer &dest) override
    {
        const size_t field_size = 24;
        scoped_pad p(field_size, padinfo_, dest);

        fmt_helper::append_string_view(days[tm_time.tm_wday], dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(months[tm_time.tm_mon], dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_mday, dest);
        dest.push_back(' ');
        // time

        fmt_helper::pad2(tm_time.tm_hour, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_int(tm_time.tm_year + 1900, dest);
    }